

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void traverseproto(global_State *g,Proto *f)

{
  TString *pTVar1;
  int local_1c;
  int i;
  Proto *f_local;
  global_State *g_local;
  
  if (f->source != (TString *)0x0) {
    (f->source->tsv).marked = (f->source->tsv).marked & 0xfc;
  }
  for (local_1c = 0; local_1c < f->sizek; local_1c = local_1c + 1) {
    if ((3 < f->k[local_1c].tt) && ((((f->k[local_1c].value.gc)->gch).marked & 3) != 0)) {
      reallymarkobject(g,f->k[local_1c].value.gc);
    }
  }
  for (local_1c = 0; local_1c < f->sizeupvalues; local_1c = local_1c + 1) {
    if (f->upvalues[local_1c] != (TString *)0x0) {
      (f->upvalues[local_1c]->tsv).marked = (f->upvalues[local_1c]->tsv).marked & 0xfc;
    }
  }
  for (local_1c = 0; local_1c < f->sizep; local_1c = local_1c + 1) {
    if ((f->p[local_1c] != (Proto *)0x0) && ((f->p[local_1c]->marked & 3) != 0)) {
      reallymarkobject(g,(GCObject *)f->p[local_1c]);
    }
  }
  for (local_1c = 0; local_1c < f->sizelocvars; local_1c = local_1c + 1) {
    if (f->locvars[local_1c].varname != (TString *)0x0) {
      pTVar1 = f->locvars[local_1c].varname;
      (pTVar1->tsv).marked = (pTVar1->tsv).marked & 0xfc;
    }
  }
  return;
}

Assistant:

static void traverseproto(global_State*g,Proto*f){
int i;
if(f->source)stringmark(f->source);
for(i=0;i<f->sizek;i++)
markvalue(g,&f->k[i]);
for(i=0;i<f->sizeupvalues;i++){
if(f->upvalues[i])
stringmark(f->upvalues[i]);
}
for(i=0;i<f->sizep;i++){
if(f->p[i])
markobject(g,f->p[i]);
}
for(i=0;i<f->sizelocvars;i++){
if(f->locvars[i].varname)
stringmark(f->locvars[i].varname);
}
}